

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

int ImGuiStb::is_word_boundary_from_right(ImGuiTextEditState *obj,int idx)

{
  bool bVar1;
  uint uVar2;
  value_type_conflict3 *pvVar3;
  
  if (0 < idx) {
    pvVar3 = ImVector<unsigned_short>::operator[](&obj->Text,idx + -1);
    bVar1 = is_separator((uint)*pvVar3);
    uVar2 = 0;
    if (bVar1) {
      pvVar3 = ImVector<unsigned_short>::operator[](&obj->Text,idx);
      bVar1 = is_separator((uint)*pvVar3);
      uVar2 = (uint)!bVar1;
    }
    return uVar2;
  }
  return 1;
}

Assistant:

static int  is_word_boundary_from_right(STB_TEXTEDIT_STRING* obj, int idx)      { return idx > 0 ? (is_separator( obj->Text[idx-1] ) && !is_separator( obj->Text[idx] ) ) : 1; }